

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall WriteUint128_Basic_Test::TestBody(WriteUint128_Basic_Test *this)

{
  allocator local_49;
  v128 local_48;
  string local_30;
  
  local_48.v = (uint8_t  [16])ZEXT816(0);
  std::__cxx11::string::string((string *)&local_30,"0",&local_49);
  AssertWriteUint128Equals(&local_48,&local_30);
  std::__cxx11::string::_M_dispose();
  local_48.v._0_12_ = ZEXT812(1);
  local_48.v[0xc] = '\0';
  local_48.v[0xd] = '\0';
  local_48.v[0xe] = '\0';
  local_48.v[0xf] = '\0';
  std::__cxx11::string::string((string *)&local_30,"1",&local_49);
  AssertWriteUint128Equals(&local_48,&local_30);
  std::__cxx11::string::_M_dispose();
  builtin_memcpy(local_48.v,"\r\x0e\x0f\x10\t\n\v\f\x05\x06\a\b\x01\x02\x03\x04",0x10);
  std::__cxx11::string::string
            ((string *)&local_30,"5332529520247008778714484145835150861",&local_49);
  AssertWriteUint128Equals(&local_48,&local_30);
  std::__cxx11::string::_M_dispose();
  local_48.v[8] = 0xbb;
  local_48.v[9] = 0xaa;
  local_48.v[10] = 0x99;
  local_48.v[0xb] = 0x88;
  local_48.v[0xc] = 0xff;
  local_48.v[0xd] = 0xee;
  local_48.v[0xe] = 0xdd;
  local_48.v[0xf] = 0xcc;
  builtin_memcpy(local_48.v,"3\"\x11",4);
  local_48.v[4] = 'w';
  local_48.v[5] = 'f';
  local_48.v[6] = 'U';
  local_48.v[7] = 'D';
  std::__cxx11::string::string
            ((string *)&local_30,"272314856204801878456120017448021860915",&local_49);
  AssertWriteUint128Equals(&local_48,&local_30);
  std::__cxx11::string::_M_dispose();
  local_48.v[8] = 0xff;
  local_48.v[9] = 0xff;
  local_48.v[10] = 0xff;
  local_48.v[0xb] = 0xff;
  local_48.v[0] = 0xff;
  local_48.v[1] = 0xff;
  local_48.v[2] = 0xff;
  local_48.v[3] = 0xff;
  local_48.v[4] = 0xff;
  local_48.v[5] = 0xff;
  local_48.v[6] = 0xff;
  local_48.v[7] = 0xff;
  local_48.v[0xc] = 0xff;
  local_48.v[0xd] = 0xff;
  local_48.v[0xe] = 0xff;
  local_48.v[0xf] = 0xff;
  std::__cxx11::string::string
            ((string *)&local_30,"340282366920938463463374607431768211455",&local_49);
  AssertWriteUint128Equals(&local_48,&local_30);
  std::__cxx11::string::_M_dispose();
  local_48.v = (uint8_t  [16])(ZEXT816(1) << 0x40);
  std::__cxx11::string::string((string *)&local_30,"18446744073709551616",&local_49);
  AssertWriteUint128Equals(&local_48,&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void AssertUint64Fails(const char* s) {
  uint64_t actual_bits;
  ASSERT_EQ(Result::Error, ParseUint64(s, s + strlen(s), &actual_bits)) << s;
}